

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::eliminatePivot(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *this,int prow,int pos,
                number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *eps)

{
  uint *puVar1;
  uint *puVar2;
  bool bVar3;
  int iVar4;
  int p_col;
  int iVar5;
  fpclass_type fVar6;
  int32_t iVar7;
  pointer pnVar8;
  Pring *pPVar9;
  Pring *pPVar10;
  Pring *pPVar11;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  int32_t iVar28;
  int *piVar29;
  int *piVar30;
  int *piVar31;
  int iVar32;
  int *piVar33;
  int *piVar34;
  int iVar35;
  int *piVar36;
  uint uVar37;
  int iVar38;
  long lVar39;
  ulong uVar40;
  long lVar41;
  int lv;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_178;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_88;
  
  piVar34 = (this->u).row.len;
  iVar38 = (this->u).row.start[prow];
  lVar39 = (long)iVar38;
  iVar4 = piVar34[prow];
  iVar35 = (int)((long)iVar4 + -1);
  piVar34[prow] = iVar35;
  iVar32 = pos + iVar38;
  pnVar8 = (this->u).row.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar34 = (this->u).row.idx;
  p_col = piVar34[iVar32];
  uVar13 = *(undefined8 *)pnVar8[iVar32].m_backend.data._M_elems;
  uVar14 = *(undefined8 *)((long)pnVar8[iVar32].m_backend.data._M_elems + 8);
  puVar2 = (uint *)((long)pnVar8[iVar32].m_backend.data._M_elems + 0x10);
  uVar15 = *(undefined8 *)puVar2;
  uVar16 = *(undefined8 *)(puVar2 + 2);
  puVar2 = (uint *)((long)pnVar8[iVar32].m_backend.data._M_elems + 0x20);
  uVar17 = *(undefined8 *)puVar2;
  uVar18 = *(undefined8 *)(puVar2 + 2);
  puVar2 = (uint *)((long)pnVar8[iVar32].m_backend.data._M_elems + 0x30);
  uVar19 = *(undefined8 *)puVar2;
  uVar20 = *(undefined8 *)(puVar2 + 2);
  iVar5 = pnVar8[iVar32].m_backend.exp;
  bVar3 = pnVar8[iVar32].m_backend.neg;
  fVar6 = pnVar8[iVar32].m_backend.fpclass;
  iVar7 = pnVar8[iVar32].m_backend.prec_elem;
  pPVar9 = (this->temp).pivot_col;
  pPVar10 = pPVar9[p_col].next;
  pPVar11 = pPVar9[p_col].prev;
  pPVar10->prev = pPVar11;
  pPVar11->next = pPVar10;
  pPVar9[p_col].next = pPVar9 + p_col;
  pPVar9[p_col].prev = pPVar9 + p_col;
  lVar41 = (long)(iVar35 + iVar38);
  piVar34[iVar32] = piVar34[lVar41];
  uVar21 = *(undefined8 *)pnVar8[lVar41].m_backend.data._M_elems;
  uVar22 = *(undefined8 *)((long)pnVar8[lVar41].m_backend.data._M_elems + 8);
  puVar2 = (uint *)((long)pnVar8[lVar41].m_backend.data._M_elems + 0x10);
  uVar23 = *(undefined8 *)puVar2;
  uVar24 = *(undefined8 *)(puVar2 + 2);
  puVar2 = (uint *)((long)pnVar8[lVar41].m_backend.data._M_elems + 0x20);
  uVar25 = *(undefined8 *)puVar2;
  uVar26 = *(undefined8 *)(puVar2 + 2);
  puVar2 = (uint *)((long)pnVar8[lVar41].m_backend.data._M_elems + 0x30);
  uVar27 = *(undefined8 *)(puVar2 + 2);
  puVar1 = (uint *)((long)pnVar8[iVar32].m_backend.data._M_elems + 0x30);
  *(undefined8 *)puVar1 = *(undefined8 *)puVar2;
  *(undefined8 *)(puVar1 + 2) = uVar27;
  puVar2 = (uint *)((long)pnVar8[iVar32].m_backend.data._M_elems + 0x20);
  *(undefined8 *)puVar2 = uVar25;
  *(undefined8 *)(puVar2 + 2) = uVar26;
  puVar2 = (uint *)((long)pnVar8[iVar32].m_backend.data._M_elems + 0x10);
  *(undefined8 *)puVar2 = uVar23;
  *(undefined8 *)(puVar2 + 2) = uVar24;
  *(undefined8 *)pnVar8[iVar32].m_backend.data._M_elems = uVar21;
  *(undefined8 *)((long)pnVar8[iVar32].m_backend.data._M_elems + 8) = uVar22;
  pnVar8[iVar32].m_backend.exp = pnVar8[lVar41].m_backend.exp;
  pnVar8[iVar32].m_backend.neg = pnVar8[lVar41].m_backend.neg;
  iVar28 = pnVar8[lVar41].m_backend.prec_elem;
  pnVar8[iVar32].m_backend.fpclass = pnVar8[lVar41].m_backend.fpclass;
  pnVar8[iVar32].m_backend.prec_elem = iVar28;
  iVar38 = (this->temp).stage;
  (this->temp).stage = iVar38 + 1;
  local_88.m_backend.data._M_elems._0_8_ = uVar13;
  local_88.m_backend.data._M_elems._8_8_ = uVar14;
  local_88.m_backend.data._M_elems._16_8_ = uVar15;
  local_88.m_backend.data._M_elems._24_8_ = uVar16;
  local_88.m_backend.data._M_elems._32_8_ = uVar17;
  local_88.m_backend.data._M_elems._40_8_ = uVar18;
  local_88.m_backend.data._M_elems._48_8_ = uVar19;
  local_88.m_backend.data._M_elems._56_8_ = uVar20;
  local_88.m_backend.exp = iVar5;
  local_88.m_backend.neg = bVar3;
  local_88.m_backend.fpclass = fVar6;
  local_88.m_backend.prec_elem = iVar7;
  setPivot(this,iVar38,p_col,prow,&local_88);
  iVar38 = (this->temp).s_cact[p_col];
  iVar32 = -1;
  if (1 < iVar38) {
    iVar32 = makeLvec(this,iVar38 + -1,prow);
  }
  if (iVar4 < 2) {
    piVar30 = (this->u).col.len;
    piVar34 = (this->temp).s_cact;
    piVar31 = (this->u).col.idx;
    piVar33 = (this->u).col.start;
  }
  else {
    do {
      iVar38 = (this->u).row.idx[lVar39];
      (this->temp).s_mark[iVar38] = 1;
      pnVar8 = (this->u).row.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar12 = this->work;
      uVar21 = *(undefined8 *)pnVar8[lVar39].m_backend.data._M_elems;
      uVar22 = *(undefined8 *)((long)pnVar8[lVar39].m_backend.data._M_elems + 8);
      puVar2 = (uint *)((long)pnVar8[lVar39].m_backend.data._M_elems + 0x10);
      uVar23 = *(undefined8 *)puVar2;
      uVar24 = *(undefined8 *)(puVar2 + 2);
      puVar2 = (uint *)((long)pnVar8[lVar39].m_backend.data._M_elems + 0x20);
      uVar25 = *(undefined8 *)puVar2;
      uVar26 = *(undefined8 *)(puVar2 + 2);
      puVar2 = (uint *)((long)pnVar8[lVar39].m_backend.data._M_elems + 0x30);
      uVar27 = *(undefined8 *)(puVar2 + 2);
      puVar1 = pnVar12[iVar38].m_backend.data._M_elems + 0xc;
      *(undefined8 *)puVar1 = *(undefined8 *)puVar2;
      *(undefined8 *)(puVar1 + 2) = uVar27;
      puVar2 = pnVar12[iVar38].m_backend.data._M_elems + 8;
      *(undefined8 *)puVar2 = uVar25;
      *(undefined8 *)(puVar2 + 2) = uVar26;
      puVar2 = pnVar12[iVar38].m_backend.data._M_elems + 4;
      *(undefined8 *)puVar2 = uVar23;
      *(undefined8 *)(puVar2 + 2) = uVar24;
      *(undefined8 *)pnVar12[iVar38].m_backend.data._M_elems = uVar21;
      *(undefined8 *)(pnVar12[iVar38].m_backend.data._M_elems + 2) = uVar22;
      pnVar12[iVar38].m_backend.exp = pnVar8[lVar39].m_backend.exp;
      pnVar12[iVar38].m_backend.neg = pnVar8[lVar39].m_backend.neg;
      iVar28 = pnVar8[lVar39].m_backend.prec_elem;
      pnVar12[iVar38].m_backend.fpclass = pnVar8[lVar39].m_backend.fpclass;
      pnVar12[iVar38].m_backend.prec_elem = iVar28;
      pPVar9 = (this->temp).pivot_col;
      pPVar10 = pPVar9[iVar38].next;
      pPVar9 = pPVar9[iVar38].prev;
      pPVar10->prev = pPVar9;
      pPVar9->next = pPVar10;
      piVar31 = (this->u).col.idx;
      piVar33 = (this->u).col.start;
      piVar30 = (this->u).col.len;
      piVar34 = (this->temp).s_cact;
      iVar35 = (piVar30[iVar38] + piVar33[iVar38]) - piVar34[iVar38];
      piVar29 = piVar31 + iVar35;
      do {
        piVar36 = piVar29;
        piVar29 = piVar36 + 1;
      } while (*piVar36 != prow);
      *piVar36 = piVar31[iVar35];
      piVar31[iVar35] = prow;
      piVar34[iVar38] = piVar34[iVar38] + -1;
      lVar39 = lVar39 + 1;
    } while (lVar39 < lVar41);
  }
  iVar35 = piVar30[p_col];
  uVar40 = (long)iVar35 - (long)piVar34[p_col];
  iVar38 = piVar31[(long)piVar33[p_col] + uVar40];
  lv = iVar32;
  if (iVar38 != prow) {
    do {
      iVar32 = lv + 1;
      local_d8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
      local_d8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
      local_d8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
      local_d8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
      local_d8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
      local_d8.m_backend.data._M_elems._40_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 10)
      ;
      local_d8.m_backend.data._M_elems._48_8_ =
           *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
      local_d8.m_backend.data._M_elems._56_8_ =
           *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
      local_d8.m_backend.exp = (eps->m_backend).exp;
      local_d8.m_backend.neg = (eps->m_backend).neg;
      local_d8.m_backend.fpclass = (eps->m_backend).fpclass;
      local_d8.m_backend.prec_elem = (eps->m_backend).prec_elem;
      local_178.m_backend.data._M_elems._0_8_ = uVar13;
      local_178.m_backend.data._M_elems._8_8_ = uVar14;
      local_178.m_backend.data._M_elems._16_8_ = uVar15;
      local_178.m_backend.data._M_elems._24_8_ = uVar16;
      local_178.m_backend.data._M_elems._32_8_ = uVar17;
      local_178.m_backend.data._M_elems._40_8_ = uVar18;
      local_178.m_backend.data._M_elems._48_8_ = uVar19;
      local_178.m_backend.data._M_elems._56_8_ = uVar20;
      local_178.m_backend.exp = iVar5;
      local_178.m_backend.neg = bVar3;
      local_178.m_backend.fpclass = fVar6;
      local_178.m_backend.prec_elem = iVar7;
      updateRow(this,iVar38,lv,prow,p_col,&local_178,&local_d8);
      uVar37 = (int)uVar40 + 1;
      uVar40 = (ulong)uVar37;
      iVar38 = (this->u).col.idx[(int)((this->u).col.start[p_col] + uVar37)];
      lv = iVar32;
    } while (iVar38 != prow);
    piVar30 = (this->u).col.len;
    iVar35 = piVar30[p_col];
  }
  iVar38 = (int)uVar40 + 1;
  if (iVar38 < iVar35) {
    do {
      local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
      local_128.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
      local_128.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4)
      ;
      local_128.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6)
      ;
      local_128.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8)
      ;
      local_128.m_backend.data._M_elems._40_8_ =
           *(undefined8 *)((eps->m_backend).data._M_elems + 10);
      local_128.m_backend.data._M_elems._48_8_ =
           *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
      local_128.m_backend.data._M_elems._56_8_ =
           *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
      local_128.m_backend.exp = (eps->m_backend).exp;
      local_128.m_backend.neg = (eps->m_backend).neg;
      local_128.m_backend.fpclass = (eps->m_backend).fpclass;
      local_128.m_backend.prec_elem = (eps->m_backend).prec_elem;
      local_1c8.m_backend.data._M_elems._0_8_ = uVar13;
      local_1c8.m_backend.data._M_elems._8_8_ = uVar14;
      local_1c8.m_backend.data._M_elems._16_8_ = uVar15;
      local_1c8.m_backend.data._M_elems._24_8_ = uVar16;
      local_1c8.m_backend.data._M_elems._32_8_ = uVar17;
      local_1c8.m_backend.data._M_elems._40_8_ = uVar18;
      local_1c8.m_backend.data._M_elems._48_8_ = uVar19;
      local_1c8.m_backend.data._M_elems._56_8_ = uVar20;
      local_1c8.m_backend.exp = iVar5;
      local_1c8.m_backend.neg = bVar3;
      local_1c8.m_backend.fpclass = fVar6;
      local_1c8.m_backend.prec_elem = iVar7;
      updateRow(this,(this->u).col.idx[(this->u).col.start[p_col] + iVar38],iVar32,prow,p_col,
                &local_1c8,&local_128);
      iVar38 = iVar38 + 1;
      iVar32 = iVar32 + 1;
    } while (iVar35 != iVar38);
    piVar30 = (this->u).col.len;
    iVar35 = piVar30[p_col];
  }
  piVar30[p_col] = iVar35 - (this->temp).s_cact[p_col];
  if (1 < iVar4) {
    lVar41 = (long)(this->u).row.start[prow];
    lVar39 = (long)iVar4 + -1 + lVar41;
    do {
      iVar38 = (this->u).row.idx[lVar41];
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                (&this->work[iVar38].m_backend,0);
      (this->temp).s_mark[iVar38] = 0;
      pPVar9 = (this->temp).pivot_colNZ;
      pPVar10 = (this->temp).pivot_col;
      iVar4 = (this->temp).s_cact[iVar38];
      pPVar11 = pPVar9[iVar4].next;
      pPVar10[iVar38].next = pPVar11;
      pPVar11->prev = pPVar10 + iVar38;
      pPVar10[iVar38].prev = pPVar9 + iVar4;
      pPVar9[iVar4].next = pPVar10 + iVar38;
      lVar41 = lVar41 + 1;
    } while (lVar41 < lVar39);
  }
  return;
}

Assistant:

void CLUFactor<R>::eliminatePivot(int prow, int pos, R eps)
{
   int i, j, k, m = -1;
   int lv = -1;  // This value should never be used.
   int pcol;
   R pval;
   int pbeg = u.row.start[prow];
   int plen = --(u.row.len[prow]);
   int pend = pbeg + plen;


   /*  extract pivot element   */
   i = pbeg + pos;
   pcol = u.row.idx[i];
   pval = u.row.val[i];
   removeDR(temp.pivot_col[pcol]);
   initDR(temp.pivot_col[pcol]);

   /*  remove pivot from pivot row     */
   u.row.idx[i] = u.row.idx[pend];
   u.row.val[i] = u.row.val[pend];

   /*  set pivot element and construct L VectorBase<R> */
   setPivot(temp.stage++, pcol, prow, pval);

   /**@todo If this test failes, lv has no value. I suppose that in this
    *       case none of the loops below that uses lv is executed.
    *       But this is unproven.
    */

   if(temp.s_cact[pcol] - 1 > 0)
      lv = makeLvec(temp.s_cact[pcol] - 1, prow);

   /*  init working VectorBase<R>,
    *  remove pivot row from working matrix
    *  and remove columns from list.
    */
   for(i = pbeg; i < pend; ++i)
   {
      j = u.row.idx[i];
      temp.s_mark[j] = 1;
      work[j] = u.row.val[i];
      removeDR(temp.pivot_col[j]);
      m = u.col.start[j] + u.col.len[j] - temp.s_cact[j];

      for(k = m; u.col.idx[k] != prow; ++k)
         ;

      u.col.idx[k] = u.col.idx[m];

      u.col.idx[m] = prow;

      temp.s_cact[j]--;
   }

   /*  perform L and update loop
    */
   for(i = u.col.len[pcol] - temp.s_cact[pcol];
         (m = u.col.idx[u.col.start[pcol] + i]) != prow;
         ++i)
   {
      assert(row.perm[m] < 0);
      assert(lv >= 0);
      /* coverity[negative_returns] */
      updateRow(m, lv++, prow, pcol, pval, eps);
   }

   /*  skip pivot row  */

   m = u.col.len[pcol];

   for(++i; i < m; ++i)
   {
      assert(lv >= 0);
      /* coverity[negative_returns] */
      updateRow(u.col.idx[u.col.start[pcol] + i], lv++, prow, pcol, pval, eps);
   }

   /*  remove pivot column from column file.
    */
   u.col.len[pcol] -= temp.s_cact[pcol];

   /*  clear working VectorBase<R> and reinsert columns to lists
    */
   for(i = u.row.start[prow], pend = i + plen; i < pend; ++i)
   {
      j = u.row.idx[i];
      work[j] = 0;
      temp.s_mark[j] = 0;
      init2DR(temp.pivot_col[j], temp.pivot_colNZ[temp.s_cact[j]]);
      assert(col.perm[j] < 0);
   }
}